

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O0

void zzRedMont(word *a,word *mod,size_t n,word mont_param,void *stack)

{
  word wVar1;
  long in_RCX;
  ulong in_RDX;
  word *in_RSI;
  word *in_RDI;
  size_t i;
  word w;
  word carry;
  ulong local_40;
  word local_38;
  ulong local_30;
  
  local_30 = 0;
  local_38 = 0;
  for (local_40 = 0; local_40 < in_RDX; local_40 = local_40 + 1) {
    local_38 = in_RDI[local_40] * in_RCX;
    wVar1 = zzAddMulW(in_RDI + local_40,in_RSI,in_RDX,local_38);
    wVar1 = zzAddW2(in_RDI + local_40 + in_RDX,in_RDX - local_40,wVar1);
    local_30 = wVar1 | local_30;
  }
  for (local_40 = 0; local_40 < in_RDX; local_40 = local_40 + 1) {
    in_RDI[local_40] = in_RDI[in_RDX + local_40];
    local_38 = (long)(int)(uint)(in_RSI[local_40] < in_RDI[local_40]) |
               (long)(int)(uint)(in_RSI[local_40] == in_RDI[local_40]) & local_38;
  }
  zzSubAndW(in_RDI,in_RSI,in_RDX,-(local_30 | local_38));
  return;
}

Assistant:

void SAFE(zzRedMont)(word a[], const word mod[], size_t n, 
	register word mont_param, void* stack)
{
	register word carry = 0;
	register word w = 0;
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(n > 0 && mod[n - 1] != 0 && mod[0] % 2);
	ASSERT((word)(mod[0] * mont_param + 1) == 0);
	// редукция в редакции Дуссе -- Калиски
	for (i = 0; i < n; ++i)
	{
		zzMul11Lo(w, a[i], mont_param);
		carry |= zzAddW2(a + i + n, n - i, zzAddMulW(a + i, mod, n, w));
	}
	ASSERT(wwIsZero(a, n));
	// a <- a / B^n, a >= mod?
	for (i = 0; i < n; ++i)
	{
		a[i] = a[n + i];
		w &= wordEq01(mod[i], a[i]);
		w |= wordLess01(mod[i], a[i]);
	}
	w |= carry, w = WORD_0 - w;
	zzSubAndW(a, mod, n, w);
	// очистка
	carry = w = 0;
}